

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  undefined1 local_b0 [8];
  ImFontConfig font_cfg;
  ImWchar *glyph_ranges_local;
  ImFontConfig *font_cfg_template_local;
  float size_pixels_local;
  int ttf_size_local;
  void *ttf_data_local;
  ImFontAtlas *this_local;
  
  font_cfg.DstFont = (ImFont *)glyph_ranges;
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)local_b0);
  }
  else {
    memcpy(local_b0,font_cfg_template,0x80);
  }
  if (local_b0 == (undefined1  [8])0x0) {
    if (font_cfg.DstFont != (ImFont *)0x0) {
      font_cfg._48_8_ = font_cfg.DstFont;
    }
    local_b0 = (undefined1  [8])ttf_data;
    font_cfg.FontData._0_4_ = ttf_size;
    font_cfg._12_4_ = size_pixels;
    pIVar1 = AddFont(this,(ImFontConfig *)local_b0);
    return pIVar1;
  }
  __assert_fail("font_cfg.FontData == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x62b,
                "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
               );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}